

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

void __thiscall
google::protobuf::io::Printer::Printer
          (Printer *this,ZeroCopyOutputStream *output,char variable_delimiter,
          AnnotationCollector *annotation_collector)

{
  Options options;
  undefined7 uStack_3f;
  byte bStack_8;
  undefined6 uStack_6;
  
  options._1_7_ = uStack_3f;
  options.variable_delimiter = variable_delimiter;
  options.enable_codegen_trace.super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_engaged = false;
  options.enable_codegen_trace.super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_payload = (_Storage<bool,_true>)bStack_8;
  options._58_6_ = uStack_6;
  options.annotation_collector = annotation_collector;
  options.comment_start._M_len = 2;
  options.comment_start._M_str = "//";
  options.ignored_comment_start._M_len = 3;
  options.ignored_comment_start._M_str = "//~";
  options.spaces_per_indent = 2;
  Printer(this,output,options);
  return;
}

Assistant:

Printer::Printer(ZeroCopyOutputStream* output, char variable_delimiter,
                 AnnotationCollector* annotation_collector)
    : Printer(output, Options{variable_delimiter, annotation_collector}) {}